

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         write_significand<fmt::v10::appender,char,unsigned_long,fmt::v10::detail::digit_grouping<char>>
                   (appender out,unsigned_long significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar1;
  char *pcVar2;
  ulong uVar3;
  unsigned_long uVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  format_decimal_result<char_*> fVar8;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char cStack_268;
  char acStack_267 [31];
  undefined8 local_248;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    if (decimal_point == '\0') {
      fVar8 = format_decimal<char,unsigned_long>((char *)&local_248,significand,significand_size);
      pcVar2 = fVar8.end;
    }
    else {
      pcVar2 = (char *)((long)&local_248 + (long)significand_size + 1);
      uVar6 = significand_size - integral_size;
      pcVar5 = pcVar2;
      if (1 < (int)uVar6) {
        uVar7 = (uVar6 >> 1) + 1;
        uVar4 = significand;
        do {
          significand = uVar4 / 100;
          *(undefined2 *)(pcVar5 + -2) =
               *(undefined2 *)
                (
                "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                + (uVar4 % 100) * 2);
          pcVar5 = pcVar5 + -2;
          uVar7 = uVar7 - 1;
          uVar4 = significand;
        } while (1 < uVar7);
      }
      uVar3 = significand;
      if ((uVar6 & 1) != 0) {
        uVar3 = significand / 10;
        pcVar5[-1] = (char)significand + (char)uVar3 * -10 | 0x30;
        pcVar5 = pcVar5 + -1;
      }
      pcVar5[-1] = decimal_point;
      format_decimal<char,unsigned_long>(pcVar5 + (-1 - (long)integral_size),uVar3,integral_size);
    }
    bVar1.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>((char *)&local_248,pcVar2,out);
  }
  else {
    local_238 = 0;
    local_248 = &PTR_grow_0013a9a8;
    local_230 = 500;
    local_240 = local_228;
    if (decimal_point == '\0') {
      fVar8 = format_decimal<char,unsigned_long>(&cStack_268,significand,significand_size);
      pcVar2 = fVar8.end;
    }
    else {
      pcVar2 = acStack_267 + significand_size;
      uVar6 = significand_size - integral_size;
      pcVar5 = pcVar2;
      if (1 < (int)uVar6) {
        uVar7 = (uVar6 >> 1) + 1;
        uVar4 = significand;
        do {
          significand = uVar4 / 100;
          *(undefined2 *)(pcVar5 + -2) =
               *(undefined2 *)
                (
                "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                + (uVar4 % 100) * 2);
          pcVar5 = pcVar5 + -2;
          uVar7 = uVar7 - 1;
          uVar4 = significand;
        } while (1 < uVar7);
      }
      uVar3 = significand;
      if ((uVar6 & 1) != 0) {
        uVar3 = significand / 10;
        pcVar5[-1] = (char)significand + (char)uVar3 * -10 | 0x30;
        pcVar5 = pcVar5 + -1;
      }
      pcVar5[-1] = decimal_point;
      format_decimal<char,unsigned_long>(pcVar5 + (-1 - (long)integral_size),uVar3,integral_size);
    }
    copy_str_noinline<char,char*,fmt::v10::appender>(&cStack_268,pcVar2,(appender)&local_248);
    if (integral_size < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/evaikene[P]filefind/fmt/core.h"
                  ,0x178,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_240;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    bVar1.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>
                   (local_240 + (uint)integral_size,local_240 + local_238,out);
    if (local_240 != local_228) {
      operator_delete(local_240);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}